

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

Bool prvTidyIsCSS1Selector(ctmbstr buf)

{
  byte bVar1;
  bool bVar2;
  ushort **ppuVar3;
  int iVar4;
  long lVar5;
  
  lVar5 = 0;
  iVar4 = 0;
  do {
    bVar1 = buf[lVar5];
    if (bVar1 == 0x5c) {
      iVar4 = 1;
    }
    else {
      if (bVar1 == 0) {
        return yes;
      }
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[bVar1] >> 0xb & 1) == 0) {
        bVar2 = iVar4 < 1;
        iVar4 = 0;
        if ((bVar2) &&
           ((bVar1 < 0xa1 && ((ulong)bVar1 != 0x2d || (int)lVar5 == 0)) &&
            ((byte)((*ppuVar3)[bVar1] >> 10) & 1) == 0)) {
          return no;
        }
      }
      else {
        if (4 < iVar4) {
          return no;
        }
        iVar4 = iVar4 + (uint)(0 < iVar4);
        if (iVar4 < 1 && (int)lVar5 == 0) {
          return no;
        }
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

Bool TY_(IsCSS1Selector)( ctmbstr buf )
{
    Bool valid = yes;
    int esclen = 0;
    byte c;
    int pos;

    for ( pos=0; valid && (c = *buf++); ++pos )
    {
        if ( c == '\\' )
        {
            esclen = 1;  /* ab\555\444 is 4 chars {'a', 'b', \555, \444} */
        }
        else if ( isdigit( c ) )
        {
            /* Digit not 1st, unless escaped (Max length "\112F") */
            if ( esclen > 0 )
                valid = ( ++esclen < 6 );
            if ( valid )
                valid = ( pos>0 || esclen>0 );
        }
        else
        {
            valid = (
                esclen > 0                       /* Escaped? Anything goes. */
                || ( pos>0 && c == '-' )         /* Dash cannot be 1st char */
                || isalpha(c)                    /* a-z, A-Z anywhere */
                || ( c >= 161 )                  /* Unicode 161-255 anywhere */
            );
            esclen = 0;
        }
    }
    return valid;
}